

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingInfoWrapper.hpp
# Opt level: O1

void __thiscall
VulkanUtilities::RenderingInfoWrapper::SetColorAttachmentClearValue
          (RenderingInfoWrapper *this,uint32_t Index,VkClearColorValue *ClearValue)

{
  VkClearValue *pVVar1;
  VkClearDepthStencilValue VVar2;
  char (*in_RCX) [34];
  string msg;
  string local_40;
  
  if ((this->m_RI).colorAttachmentCount <= Index) {
    Diligent::FormatString<char[26],char[34]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Index < m_RI.colorAttachmentCount",in_RCX);
    Diligent::DebugAssertionFailed
              (local_40._M_dataplus._M_p,"SetColorAttachmentClearValue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/RenderingInfoWrapper.hpp"
               ,0x69);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  VVar2 = *(VkClearDepthStencilValue *)(ClearValue->float32 + 2);
  pVVar1 = &(this->m_Attachments)._M_t.
            super___uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
            ._M_t.
            super__Tuple_impl<0UL,_VkRenderingAttachmentInfo_*,_std::default_delete<VkRenderingAttachmentInfo[]>_>
            .super__Head_base<0UL,_VkRenderingAttachmentInfo_*,_false>._M_head_impl[Index].
            clearValue;
  pVVar1->depthStencil = *(VkClearDepthStencilValue *)ClearValue;
  (&pVVar1->depthStencil)[1] = VVar2;
  (this->m_Attachments)._M_t.
  super___uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_VkRenderingAttachmentInfo_*,_std::default_delete<VkRenderingAttachmentInfo[]>_>
  .super__Head_base<0UL,_VkRenderingAttachmentInfo_*,_false>._M_head_impl[Index].loadOp =
       VK_ATTACHMENT_LOAD_OP_CLEAR;
  this->m_AttachmentClearMask = this->m_AttachmentClearMask | 1 << ((byte)Index & 0x1f);
  return;
}

Assistant:

void SetColorAttachmentClearValue(uint32_t Index, const VkClearColorValue& ClearValue)
    {
        VERIFY_EXPR(Index < m_RI.colorAttachmentCount);
        m_Attachments[Index].clearValue.color = ClearValue;
        m_Attachments[Index].loadOp           = VK_ATTACHMENT_LOAD_OP_CLEAR;
        m_AttachmentClearMask |= 1u << Index;
    }